

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-md5.c
# Opt level: O1

void p_crypto_hash_md5_finish(PHashMD5 *ctx)

{
  puint32 pVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  pVar1 = ctx->len_high;
  uVar2 = ctx->len_low;
  uVar5 = uVar2 & 0x3f;
  uVar3 = (uint)(0x37 < uVar5) << 6 | 0x38;
  uVar4 = uVar3 - uVar5;
  if (uVar4 != 0 && uVar5 <= uVar3) {
    p_crypto_hash_md5_update(ctx,pp_crypto_hash_md5_pad,(ulong)uVar4);
  }
  (ctx->buf).buf_w[0xe] = uVar2 << 3;
  (ctx->buf).buf_w[0xf] = pVar1 << 3 | uVar2 >> 0x1d;
  pp_crypto_hash_md5_process(ctx,(puint32 *)ctx);
  return;
}

Assistant:

void
p_crypto_hash_md5_finish (PHashMD5 *ctx)
{
	puint32	high;
	puint32	low;
	pint	left;
	pint	last;

	left = ctx->len_low & 0x3F;
	last = (left < 56) ? (56 - left) : (120 - left);

	low = ctx->len_low << 3;
	high = ctx->len_high << 3
	     | ctx->len_low >> 29;

	if (last > 0)
		p_crypto_hash_md5_update (ctx, pp_crypto_hash_md5_pad, (psize) last);

	ctx->buf.buf_w[14] = low;
	ctx->buf.buf_w[15] = high;

	pp_crypto_hash_md5_swap_bytes (ctx->buf.buf_w, 14);
	pp_crypto_hash_md5_process (ctx, ctx->buf.buf_w);

	pp_crypto_hash_md5_swap_bytes (ctx->hash, 4);
}